

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O0

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  undefined1 local_34 [8];
  lws_pollargs pa1;
  lws_vhost *vh;
  int allow_local;
  lws_context_per_thread *pt_local;
  lws_context *context_local;
  
  for (pa1._4_8_ = context->vhost_list; pa1._4_8_ != 0;
      pa1._4_8_ = *(undefined8 *)(pa1._4_8_ + 0x150)) {
    if (*(long *)(pa1._4_8_ + 0x160) != 0) {
      if (allow == 0) {
        _lws_change_pollfd(*(lws **)(pa1._4_8_ + 0x160),1,0,(lws_pollargs *)local_34);
      }
      else {
        _lws_change_pollfd(*(lws **)(pa1._4_8_ + 0x160),0,1,(lws_pollargs *)local_34);
      }
    }
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		if (vh->lserv_wsi) {
			if (allow)
				_lws_change_pollfd(vh->lserv_wsi,
					   0, LWS_POLLIN, &pa1);
			else
				_lws_change_pollfd(vh->lserv_wsi,
					   LWS_POLLIN, 0, &pa1);
		}
		vh = vh->vhost_next;
	}
}